

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

void cp_expr_unary(CPState *cp,CPValue *k)

{
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar1;
  int iVar2;
  CTSize CVar3;
  CTypeID CVar4;
  CPToken CVar5;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar6;
  CType *ct;
  CType *pCVar7;
  GCstr *pGVar8;
  uint uVar9;
  MSize MVar10;
  CTSize local_3c;
  CPValue k2;
  
  iVar2 = cp->depth;
  cp->depth = iVar2 + 1;
  if (0x13 < iVar2) {
    cp_err(cp,LJ_ERR_XLEVELS);
  }
  if (cp->tok == 0x102) {
    *k = cp->val;
LAB_0014fe2c:
    cp_next(cp);
  }
  else {
    iVar2 = cp_opt(cp,0x2b);
    if (iVar2 != 0) {
      cp_expr_unary(cp,k);
      goto LAB_0014fece;
    }
    iVar2 = cp_opt(cp,0x2d);
    if (iVar2 != 0) {
      cp_expr_unary(cp,k);
      (k->field_0).i32 = -(k->field_0).i32;
      goto LAB_0014fece;
    }
    iVar2 = cp_opt(cp,0x7e);
    if (iVar2 != 0) {
      cp_expr_unary(cp,k);
      (k->field_0).u32 = ~(k->field_0).u32;
      goto LAB_0014fece;
    }
    iVar2 = cp_opt(cp,0x21);
    if (iVar2 != 0) {
      cp_expr_unary(cp,k);
      aVar1.i32._1_3_ = 0;
      aVar1.i32._0_1_ = (k->field_0).i32 == 0;
      k->field_0 = aVar1;
      k->id = 9;
      goto LAB_0014fece;
    }
    iVar2 = cp_opt(cp,0x28);
    if (iVar2 != 0) {
      iVar2 = cp_istypedecl(cp);
      if (iVar2 == 0) {
        cp_expr_comma(cp,k);
        cp_check(cp,0x29);
      }
      else {
        CVar4 = cp_decl_abstract(cp);
        cp_check(cp,0x29);
        cp_expr_unary(cp,k);
        k->id = CVar4;
      }
      goto LAB_0014fece;
    }
    iVar2 = cp_opt(cp,0x2a);
    if (iVar2 == 0) {
      iVar2 = cp_opt(cp,0x26);
      if (iVar2 == 0) {
        iVar2 = cp_opt(cp,0x12a);
        if (iVar2 == 0) {
          iVar2 = cp_opt(cp,299);
          if (iVar2 == 0) {
            iVar2 = cp->tok;
            if (iVar2 == 0x101) {
              MVar10 = cp->str->len;
              while (CVar5 = cp_next(cp), CVar5 == 0x101) {
                MVar10 = MVar10 + cp->str->len;
              }
              (k->field_0).i32 = MVar10 + 1;
              k->id = 0x14;
              goto LAB_0014fece;
            }
            if (iVar2 != 0x100) {
LAB_00150235:
              cp_errmsg(cp,iVar2,LJ_ERR_XSYMBOL);
            }
            uVar9 = cp->ct->info >> 0x1c;
            if (uVar9 == 6) {
              aVar6 = (anon_union_4_2_43a9a9ed_for_CPValue_0)(cp->val).id;
              k->field_0 = aVar6;
            }
            else {
              if (uVar9 == 0xc) {
                aVar1 = (anon_union_4_2_43a9a9ed_for_CPValue_0)(cp->val).id;
              }
              else {
                if (uVar9 != 0xb) goto LAB_00150235;
                aVar1 = (anon_union_4_2_43a9a9ed_for_CPValue_0)cp->ct->size;
              }
              k->field_0 = aVar1;
              aVar6.i32._2_2_ = 0;
              aVar6.i32._0_2_ = (ushort)cp->ct->info;
            }
            k->id = (CTypeID)aVar6;
            goto LAB_0014fe2c;
          }
          iVar2 = 0;
        }
        else {
          iVar2 = 1;
        }
        cp_expr_sizeof(cp,k,iVar2);
        goto LAB_0014fece;
      }
      cp_expr_unary(cp,k);
      uVar9 = lj_ctype_intern(cp->cts,k->id + 0x20030000,8);
    }
    else {
      cp_expr_unary(cp,k);
      pCVar7 = lj_ctype_rawref(cp->cts,k->id);
      if ((pCVar7->info & 0xe0000000) != 0x20000000) {
        cp_err_badidx(cp,pCVar7);
      }
      (k->field_0).i32 = 0;
      uVar9 = (uint)(ushort)pCVar7->info;
    }
    k->id = uVar9;
  }
LAB_0014fece:
  do {
    iVar2 = cp_opt(cp,0x5b);
    if (iVar2 == 0) {
      if ((cp->tok != 0x10c) && (cp->tok != 0x2e)) {
        cp->depth = cp->depth + -1;
        return;
      }
      pCVar7 = lj_ctype_rawref(cp->cts,k->id);
      if (cp->tok == 0x10c) {
        if ((pCVar7->info & 0xe0000000) != 0x20000000) {
          cp_err_badidx(cp,pCVar7);
        }
        pCVar7 = lj_ctype_rawref(cp->cts,pCVar7->info & 0xffff);
      }
      cp_next(cp);
      if (cp->tok != 0x100) {
        cp_err_token(cp,0x100);
      }
      if ((((pCVar7->info & 0xf0000000) != 0x10000000) || (pCVar7->size == 0xffffffff)) ||
         (ct = lj_ctype_getfieldq(cp->cts,pCVar7,cp->str,&local_3c,(CTInfo *)0x0),
         ct == (CType *)0x0)) {
LAB_0015011a:
        pGVar8 = lj_ctype_repr(cp->cts->L,(CTypeID)((ulong)((long)pCVar7 - (long)cp->cts->tab) >> 4)
                               ,(GCstr *)0x0);
        cp_errmsg(cp,0,LJ_ERR_FFI_BADMEMBER,pGVar8 + 1,cp->str + 1);
      }
      uVar9 = ct->info >> 0x1c;
      if (uVar9 == 0xb) {
        CVar3 = ct->size;
      }
      else {
        CVar3 = 0;
        if (uVar9 == 10) goto LAB_0015011a;
      }
      (k->field_0).i32 = CVar3;
      cp_next(cp);
    }
    else {
      cp_expr_comma(cp,&k2);
      ct = lj_ctype_rawref(cp->cts,k->id);
      if (((ct->info & 0xe0000000) != 0x20000000) &&
         (ct = lj_ctype_rawref(cp->cts,k2.id), (ct->info & 0xe0000000) != 0x20000000)) {
        cp_err_badidx(cp,ct);
      }
      cp_check(cp,0x5d);
      (k->field_0).i32 = 0;
    }
    k->id = (uint)(ushort)ct->info;
  } while( true );
}

Assistant:

static void cp_expr_unary(CPState *cp, CPValue *k)
{
  if (++cp->depth > CPARSE_MAX_DECLDEPTH) cp_err(cp, LJ_ERR_XLEVELS);
  cp_expr_prefix(cp, k);
  cp_expr_postfix(cp, k);
  cp->depth--;
}